

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

bool ok(HighsIndexCollection *index_collection)

{
  uint uVar1;
  pointer piVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  
  if (index_collection->is_interval_ == true) {
    if (index_collection->is_set_ == false) {
      if (index_collection->is_mask_ != true) {
        if (index_collection->from_ < 0) {
          printf("Index interval lower limit is %d < 0\n");
          return false;
        }
        if (index_collection->to_ < index_collection->dimension_) {
          return true;
        }
        printf("Index interval upper limit is %d > %d\n",(ulong)(uint)index_collection->to_,
               (ulong)(index_collection->dimension_ - 1));
        return false;
      }
      pcVar6 = "Index collection is both interval and mask";
    }
    else {
      pcVar6 = "Index collection is both interval and set";
    }
  }
  else if (index_collection->is_set_ == false) {
    if (index_collection->is_mask_ == false) {
      pcVar6 = "Undefined index collection";
    }
    else {
      if ((index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar6 = "Index mask is NULL";
    }
  }
  else if (index_collection->is_mask_ == false) {
    piVar2 = (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar2 != (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      uVar4 = index_collection->dimension_ - 1;
      uVar5 = 0;
      uVar7 = (ulong)(uint)index_collection->set_num_entries_;
      if (index_collection->set_num_entries_ < 1) {
        uVar7 = uVar5;
      }
      uVar3 = 0xffffffff;
      while( true ) {
        if (uVar7 == uVar5) {
          return true;
        }
        uVar1 = piVar2[uVar5];
        if (((int)uVar1 < 0) || (index_collection->dimension_ <= (int)uVar1)) break;
        if ((int)uVar1 <= (int)uVar3) {
          pcVar6 = "Index set entry set[%d] = %d is not greater than previous entry %d\n";
          uVar4 = uVar3;
          goto LAB_003641b1;
        }
        uVar5 = uVar5 + 1;
        uVar3 = uVar1;
      }
      pcVar6 = "Index set entry set[%d] = %d is out of bounds [0, %d]\n";
LAB_003641b1:
      printf(pcVar6,uVar5,(ulong)uVar1,(ulong)uVar4);
      return false;
    }
    pcVar6 = "Index set is NULL";
  }
  else {
    pcVar6 = "Index collection is both set and mask";
  }
  puts(pcVar6);
  return false;
}

Assistant:

bool ok(const HighsIndexCollection& index_collection) {
  // Check parameter for each technique of defining an index collection
  if (index_collection.is_interval_) {
    // Changing by interval: check the parameters and that check set and mask
    // are false
    if (index_collection.is_set_) {
      printf("Index collection is both interval and set\n");
      return false;
    }
    if (index_collection.is_mask_) {
      printf("Index collection is both interval and mask\n");
      return false;
    }
    if (index_collection.from_ < 0) {
      printf("Index interval lower limit is %" HIGHSINT_FORMAT " < 0\n",
             index_collection.from_);
      return false;
    }
    if (index_collection.to_ > index_collection.dimension_ - 1) {
      printf("Index interval upper limit is %" HIGHSINT_FORMAT
             " > %" HIGHSINT_FORMAT "\n",
             index_collection.to_, index_collection.dimension_ - 1);
      return false;
    }
  } else if (index_collection.is_set_) {
    // Changing by set: check the parameters and check that interval and mask
    // are false
    if (index_collection.is_interval_) {
      printf("Index collection is both set and interval\n");
      return false;
    }
    if (index_collection.is_mask_) {
      printf("Index collection is both set and mask\n");
      return false;
    }
    if (index_collection.set_.empty()) {
      printf("Index set is NULL\n");
      return false;
    }
    // Check that the values in the vector of integers are ascending
    const vector<HighsInt>& set = index_collection.set_;
    const HighsInt num_entries = index_collection.set_num_entries_;
    const HighsInt entry_upper = index_collection.dimension_ - 1;
    HighsInt prev_set_entry = -1;
    for (HighsInt k = 0; k < num_entries; k++) {
      if (set[k] < 0 || set[k] > entry_upper) {
        printf("Index set entry set[%" HIGHSINT_FORMAT "] = %" HIGHSINT_FORMAT
               " is out of bounds [0, %" HIGHSINT_FORMAT "]\n",
               k, set[k], entry_upper);
        return false;
      }
      if (set[k] <= prev_set_entry) {
        printf("Index set entry set[%" HIGHSINT_FORMAT "] = %" HIGHSINT_FORMAT
               " is not greater than "
               "previous entry %" HIGHSINT_FORMAT "\n",
               k, set[k], prev_set_entry);
        return false;
      }
      prev_set_entry = set[k];
    }
    // This was the old check done independently, and should be
    // equivalent.
    assert(increasingSetOk(set, 0, entry_upper, true));
  } else if (index_collection.is_mask_) {
    // Changing by mask: check the parameters and check that set and interval
    // are false
    if (index_collection.mask_.empty()) {
      printf("Index mask is NULL\n");
      return false;
    }
    if (index_collection.is_interval_) {
      printf("Index collection is both mask and interval\n");
      return false;
    }
    if (index_collection.is_set_) {
      printf("Index collection is both mask and set\n");
      return false;
    }
  } else {
    // No method defined
    printf("Undefined index collection\n");
    return false;
  }
  return true;
}